

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matmul.c
# Opt level: O0

void gai_matmul_patch(char *transa,char *transb,void *alpha,void *beta,Integer g_a,Integer *alo,
                     Integer *ahi,int avec_pos,Integer g_b,Integer *blo,Integer *bhi,int bvec_pos,
                     Integer g_c,Integer *clo,Integer *chi)

{
  undefined1 auVar1 [16];
  int iVar2;
  long lVar3;
  Integer IVar4;
  logical lVar5;
  logical lVar6;
  Integer IVar7;
  long lVar8;
  double *in_RCX;
  undefined8 in_RDX;
  Integer *unaff_RBX;
  char *in_RSI;
  char *in_RDI;
  Integer in_R8;
  void *in_R9;
  Integer *unaff_R12;
  Integer unaff_R13;
  double dVar9;
  void *in_stack_00000008;
  Integer in_stack_00000018;
  void *in_stack_00000020;
  void *in_stack_00000028;
  Integer in_stack_00000038;
  void *in_stack_00000040;
  void *in_stack_00000048;
  int _i_2;
  int _i_1;
  int _i;
  Integer avail;
  Integer factor;
  Integer elems;
  long cdim_t;
  long bdim_t;
  long adim_t;
  long kdim_t;
  long jdim_t;
  long idim_t;
  int local_sync_end;
  int local_sync_begin;
  Integer max_chunk;
  Integer min_tasks;
  DoublePrecision chunk_cube;
  Integer get_new_B;
  Integer ZERO_I;
  SingleComplex ONE_CF;
  DoubleComplex ONE;
  Integer *tmphi;
  Integer *tmplo;
  Integer tmpld [7];
  Integer cdims [7];
  Integer bdims [7];
  Integer adims [7];
  Integer cjhi;
  Integer cjlo;
  Integer cihi;
  Integer cilo;
  Integer bjhi;
  Integer bjlo;
  Integer bihi;
  Integer bilo;
  Integer ajhi;
  Integer ajlo;
  Integer aihi;
  Integer ailo;
  Integer Jchunk;
  Integer Kchunk;
  Integer Ichunk;
  int cvpos;
  int bvpos;
  int avpos;
  int need_scaling;
  int cjpos;
  int cipos;
  int bjpos;
  int bipos;
  int ajpos;
  int aipos;
  Integer crank;
  Integer brank;
  Integer arank;
  Integer cdim;
  Integer bdim;
  Integer adim;
  Integer cn;
  Integer cm;
  Integer k2;
  Integer k;
  Integer m;
  Integer n;
  Integer kdim;
  Integer khi;
  Integer klo;
  Integer jdim;
  Integer jhi;
  Integer jlo;
  Integer idim;
  Integer ihi;
  Integer ilo;
  Integer j1;
  Integer j0;
  Integer i1;
  Integer i0;
  Integer ijk;
  Integer i;
  Integer iproc;
  Integer inode;
  Integer nproc;
  Integer me;
  Integer cdim2;
  Integer cdim1;
  Integer bdim2;
  Integer bdim1;
  Integer adim2;
  Integer adim1;
  Integer ctype;
  Integer btype;
  Integer atype;
  DoubleComplex *c;
  DoubleComplex *b;
  DoubleComplex *a;
  Integer in_stack_fffffffffffffb38;
  long *alpha_00;
  Integer in_stack_fffffffffffffb40;
  long *ld;
  Integer *ilo_00;
  Integer *hi;
  Integer *lo;
  Integer *dims;
  Integer *in_stack_fffffffffffffb80;
  Integer *in_stack_fffffffffffffb88;
  Integer *in_stack_fffffffffffffb90;
  Integer *in_stack_fffffffffffffb98;
  Integer *in_stack_fffffffffffffba0;
  int *in_stack_fffffffffffffba8;
  int *in_stack_fffffffffffffbb0;
  int *in_stack_fffffffffffffbb8;
  int in_stack_fffffffffffffbc0;
  long local_438;
  long local_430;
  int local_404;
  int local_400;
  int local_3fc;
  long local_3d8;
  long local_3d0;
  long local_3c8;
  long local_3c0;
  long local_3b8;
  int local_3b0;
  int local_3ac;
  long local_3a8;
  long local_3a0;
  double local_398;
  long local_390;
  undefined8 local_388;
  undefined4 local_380;
  undefined4 local_37c;
  Integer local_378 [2];
  long *local_368;
  long *local_360;
  long local_358 [6];
  Integer in_stack_fffffffffffffcd8;
  char *in_stack_fffffffffffffce0;
  long local_318;
  Integer *in_stack_fffffffffffffcf0;
  void *in_stack_fffffffffffffcf8;
  Integer *in_stack_fffffffffffffd00;
  Integer *in_stack_fffffffffffffd08;
  Integer in_stack_fffffffffffffd10;
  long local_2d8 [4];
  Integer *in_stack_fffffffffffffd48;
  Integer *in_stack_fffffffffffffd50;
  Integer *in_stack_fffffffffffffd58;
  Integer in_stack_fffffffffffffd60;
  long local_298 [8];
  long local_258;
  long local_250;
  long local_248;
  long local_240;
  long local_238;
  long local_230;
  long local_228;
  long local_220;
  long local_218;
  long local_210;
  long local_208;
  long local_200;
  long local_1f8;
  long local_1f0;
  long local_1e8;
  int local_1e0;
  int local_1dc;
  int local_1d8;
  int local_1d4;
  int local_1d0;
  int local_1cc;
  int local_1c8;
  int local_1c4;
  int local_1c0;
  int local_1bc;
  long local_1b8;
  long local_1b0;
  long local_1a8;
  long local_1a0;
  long local_198;
  long local_190;
  long local_188;
  long local_180;
  long local_178;
  long local_170;
  long local_168;
  long local_160;
  long local_158;
  long local_150;
  long local_148;
  long local_140;
  long local_138;
  long local_130;
  long local_128;
  long local_120;
  long local_118;
  long local_110;
  long local_108;
  long local_100;
  long local_f8;
  long local_f0;
  long local_e8;
  Integer local_e0;
  Integer local_d8;
  Integer local_d0;
  Integer local_c8;
  long local_c0;
  long local_b8;
  long local_b0;
  long local_a8;
  long local_a0;
  long local_98;
  long local_90;
  long local_88;
  long local_80;
  Integer *local_78;
  Integer *local_70;
  long *local_68;
  void *local_60;
  Integer local_58;
  double *local_50;
  undefined8 local_48;
  char *local_40;
  
  local_60 = in_R9;
  local_58 = in_R8;
  local_50 = in_RCX;
  local_48 = in_RDX;
  local_40 = in_RSI;
  local_c8 = pnga_nodeid();
  iVar2 = _ga_sync_begin;
  local_f0 = 0;
  local_1d4 = 1;
  local_360 = local_298;
  local_368 = local_2d8;
  local_388 = 0;
  local_3a0 = 10;
  local_378[0] = 0x3ff0000000000000;
  local_378[1] = 0;
  local_380 = 0x3f800000;
  local_37c = 0;
  local_3ac = _ga_sync_begin;
  local_3b0 = _ga_sync_end;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  if (iVar2 != 0) {
    pnga_sync();
  }
  IVar4 = pnga_total_blocks(local_58);
  if (((0 < IVar4) || (IVar4 = pnga_total_blocks(in_stack_00000018), 0 < IVar4)) ||
     (IVar4 = pnga_total_blocks(in_stack_00000038), 0 < IVar4)) {
    pnga_matmul_basic(_bjpos,_cjpos,_avpos,_cvpos,Ichunk,(Integer *)Kchunk,(Integer *)bdim,adim,
                      (Integer *)cn,(Integer *)cm,k2,(Integer *)k,(Integer *)m);
    return;
  }
  lVar5 = pnga_is_mirrored(local_58);
  lVar6 = pnga_is_mirrored(in_stack_00000018);
  if (lVar5 == lVar6) {
    lVar5 = pnga_is_mirrored(local_58);
    lVar6 = pnga_is_mirrored(in_stack_00000038);
    if (lVar5 == lVar6) goto LAB_001729b5;
  }
  pnga_nnodes();
  pnga_error(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
LAB_001729b5:
  lVar5 = pnga_is_mirrored(local_58);
  if (lVar5 == 0) {
    local_d0 = pnga_nnodes();
    local_e0 = local_c8;
  }
  else {
    local_d8 = pnga_cluster_nodeid();
    local_d0 = pnga_cluster_nprocs(0x1729e4);
    IVar4 = local_c8;
    IVar7 = pnga_cluster_procid(in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
    local_e0 = IVar4 - IVar7;
  }
  pnga_inquire(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,
               in_stack_fffffffffffffd48);
  pnga_inquire(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,
               in_stack_fffffffffffffd48);
  pnga_inquire(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,
               in_stack_fffffffffffffd48);
  if (local_1a8 < 2) {
    pnga_error(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
  }
  if (local_1b0 < 2) {
    pnga_error(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
  }
  if (local_1b8 < 2) {
    pnga_error(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
  }
  if ((local_80 != local_88) || (local_80 != local_90)) {
    pnga_error(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
  }
  if (((local_80 != 0x3ef) && (local_80 != 0x3ec)) && ((local_80 != 0x3eb && (local_80 != 0x3ee))))
  {
    pnga_error(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
  }
  gai_setup_2d_patch((Integer)&local_1d8,(char *)&local_1c0,(Integer *)&local_1bc,&local_a0,
                     &local_98,&local_218,in_stack_fffffffffffffb80,in_stack_fffffffffffffb88,
                     in_stack_fffffffffffffb90,in_stack_fffffffffffffb98,in_stack_fffffffffffffba0,
                     in_stack_fffffffffffffba8,in_stack_fffffffffffffbb0,in_stack_fffffffffffffbb8,
                     in_stack_fffffffffffffbc0);
  gai_setup_2d_patch((Integer)&local_1dc,(char *)&local_1c8,(Integer *)&local_1c4,&local_b0,
                     &local_a8,&local_238,in_stack_fffffffffffffb80,in_stack_fffffffffffffb88,
                     in_stack_fffffffffffffb90,in_stack_fffffffffffffb98,in_stack_fffffffffffffba0,
                     in_stack_fffffffffffffba8,in_stack_fffffffffffffbb0,in_stack_fffffffffffffbb8,
                     in_stack_fffffffffffffbc0);
  alpha_00 = &local_248;
  ld = &local_250;
  ilo_00 = &local_258;
  hi = &local_b8;
  lo = &local_c0;
  dims = (Integer *)&local_1cc;
  gai_setup_2d_patch((Integer)&local_1e0,(char *)&local_1d0,dims,lo,hi,ilo_00,
                     in_stack_fffffffffffffb80,in_stack_fffffffffffffb88,in_stack_fffffffffffffb90,
                     in_stack_fffffffffffffb98,in_stack_fffffffffffffba0,in_stack_fffffffffffffba8,
                     in_stack_fffffffffffffbb0,in_stack_fffffffffffffbb8,in_stack_fffffffffffffbc0);
  if ((*in_RDI == 'n') || (*in_RDI == 'N')) {
    if ((local_200 < 1) || (((local_98 < local_208 || (local_210 < 1)) || (local_a0 < local_218))))
    {
      pnga_error(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
    }
  }
  else if (((local_200 < 1) || (local_a0 < local_208)) ||
          ((local_210 < 1 || (local_98 < local_218)))) {
    pnga_error(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
  }
  if ((*local_40 == 'n') || (*local_40 == 'N')) {
    if ((local_220 < 1) || (((local_a8 < local_228 || (local_230 < 1)) || (local_b0 < local_238))))
    {
      pnga_error(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
    }
  }
  else if (((local_220 < 1) || (local_b0 < local_228)) ||
          ((local_230 < 1 || (local_a8 < local_238)))) {
    pnga_error(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
  }
  if (((local_240 < 1) || (local_b8 < local_248)) || ((local_250 < 1 || (local_c0 < local_258)))) {
    pnga_error(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
  }
  local_168 = (local_208 - local_200) + 1;
  local_170 = (local_218 - local_210) + 1;
  local_178 = (local_228 - local_220) + 1;
  local_160 = (local_238 - local_230) + 1;
  local_180 = (local_248 - local_240) + 1;
  local_188 = (local_258 - local_250) + 1;
  if (((local_168 != local_180) || (local_170 != local_178)) || (local_160 != local_188)) {
    if (((local_1d8 < 0) || (-1 < local_1dc)) || (-1 < local_1e0)) {
      if (((local_1d8 < 0) && (-1 < local_1dc)) && (local_1e0 < 0)) {
        local_1c4 = local_1c4 + -1;
        local_1c8 = local_1c8 + -1;
        local_220 = *(long *)((long)in_stack_00000020 + (long)local_1c4 * 8);
        local_228 = *(long *)((long)in_stack_00000028 + (long)local_1c4 * 8);
        local_230 = *(long *)((long)in_stack_00000020 + (long)local_1c8 * 8);
        local_238 = *(long *)((long)in_stack_00000028 + (long)local_1c8 * 8);
        local_a8 = local_2d8[local_1c4];
        local_b0 = local_2d8[local_1c8];
        local_168 = (local_208 - local_200) + 1;
        local_170 = (local_218 - local_210) + 1;
        local_178 = (local_228 - local_220) + 1;
        local_160 = (local_238 - local_230) + 1;
        local_180 = (local_248 - local_240) + 1;
        local_188 = (local_258 - local_250) + 1;
      }
      else if (((local_1d8 < 0) && (local_1dc < 0)) && (-1 < local_1e0)) {
        local_1cc = local_1cc + -1;
        local_1d0 = local_1d0 + -1;
        local_240 = *(long *)((long)in_stack_00000040 + (long)local_1cc * 8);
        local_248 = *(long *)((long)in_stack_00000048 + (long)local_1cc * 8);
        local_250 = *(long *)((long)in_stack_00000040 + (long)local_1d0 * 8);
        local_258 = *(long *)((long)in_stack_00000048 + (long)local_1d0 * 8);
        local_b8 = (&local_318)[local_1cc];
        local_c0 = (&local_318)[local_1d0];
        local_168 = (local_208 - local_200) + 1;
        local_170 = (local_218 - local_210) + 1;
        local_178 = (local_228 - local_220) + 1;
        local_160 = (local_238 - local_230) + 1;
        local_180 = (local_248 - local_240) + 1;
        local_188 = (local_258 - local_250) + 1;
      }
      else if (((local_1d8 < 0) || (local_1dc < 0)) || (-1 < local_1e0)) {
        if (((local_1d8 < 0) || (-1 < local_1dc)) || (local_1e0 < 0)) {
          if (((local_1d8 < 0) && (-1 < local_1dc)) && (-1 < local_1e0)) {
            if (local_170 != local_178) {
              local_1c4 = local_1c4 + -1;
              local_1c8 = local_1c8 + -1;
              local_220 = *(long *)((long)in_stack_00000020 + (long)local_1c4 * 8);
              local_228 = *(long *)((long)in_stack_00000028 + (long)local_1c4 * 8);
              local_230 = *(long *)((long)in_stack_00000020 + (long)local_1c8 * 8);
              local_238 = *(long *)((long)in_stack_00000028 + (long)local_1c8 * 8);
              local_a8 = local_2d8[local_1c4];
              local_b0 = local_2d8[local_1c8];
              local_168 = (local_208 - local_200) + 1;
              local_170 = (local_218 - local_210) + 1;
              local_178 = (local_228 - local_220) + 1;
              local_160 = (local_238 - local_230) + 1;
              local_180 = (local_248 - local_240) + 1;
              local_188 = (local_258 - local_250) + 1;
            }
            if (local_168 != local_180) {
              local_1cc = local_1cc + -1;
              local_1d0 = local_1d0 + -1;
              local_240 = *(long *)((long)in_stack_00000040 + (long)local_1cc * 8);
              local_248 = *(long *)((long)in_stack_00000048 + (long)local_1cc * 8);
              local_250 = *(long *)((long)in_stack_00000040 + (long)local_1d0 * 8);
              local_258 = *(long *)((long)in_stack_00000048 + (long)local_1d0 * 8);
              local_b8 = (&local_318)[local_1cc];
              local_c0 = (&local_318)[local_1d0];
              local_168 = (local_208 - local_200) + 1;
              local_170 = (local_218 - local_210) + 1;
              local_178 = (local_228 - local_220) + 1;
              local_160 = (local_238 - local_230) + 1;
              local_180 = (local_248 - local_240) + 1;
              local_188 = (local_258 - local_250) + 1;
            }
          }
          else if (((-1 < local_1d8) && (-1 < local_1dc)) && (-1 < local_1e0)) {
            pnga_error(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
          }
        }
        else {
          if (local_170 != local_178) {
            local_1bc = local_1bc + -1;
            local_1c0 = local_1c0 + -1;
            local_200 = *(long *)((long)local_60 + (long)local_1bc * 8);
            local_208 = *(long *)((long)in_stack_00000008 + (long)local_1bc * 8);
            local_210 = *(long *)((long)local_60 + (long)local_1c0 * 8);
            local_218 = *(long *)((long)in_stack_00000008 + (long)local_1c0 * 8);
            local_98 = local_298[local_1bc];
            local_a0 = local_298[local_1c0];
            local_168 = (local_208 - local_200) + 1;
            local_170 = (local_218 - local_210) + 1;
            local_178 = (local_228 - local_220) + 1;
            local_160 = (local_238 - local_230) + 1;
            local_180 = (local_248 - local_240) + 1;
            local_188 = (local_258 - local_250) + 1;
          }
          if (local_160 != local_188) {
            local_1cc = local_1cc + -1;
            local_1d0 = local_1d0 + -1;
            local_240 = *(long *)((long)in_stack_00000040 + (long)local_1cc * 8);
            local_248 = *(long *)((long)in_stack_00000048 + (long)local_1cc * 8);
            local_250 = *(long *)((long)in_stack_00000040 + (long)local_1d0 * 8);
            local_258 = *(long *)((long)in_stack_00000048 + (long)local_1d0 * 8);
            local_b8 = (&local_318)[local_1cc];
            local_c0 = (&local_318)[local_1d0];
            local_168 = (local_208 - local_200) + 1;
            local_170 = (local_218 - local_210) + 1;
            local_178 = (local_228 - local_220) + 1;
            local_160 = (local_238 - local_230) + 1;
            local_180 = (local_248 - local_240) + 1;
            local_188 = (local_258 - local_250) + 1;
          }
        }
      }
      else {
        if (local_168 != local_180) {
          local_1bc = local_1bc + -1;
          local_1c0 = local_1c0 + -1;
          local_200 = *(long *)((long)local_60 + (long)local_1bc * 8);
          local_208 = *(long *)((long)in_stack_00000008 + (long)local_1bc * 8);
          local_210 = *(long *)((long)local_60 + (long)local_1c0 * 8);
          local_218 = *(long *)((long)in_stack_00000008 + (long)local_1c0 * 8);
          local_98 = local_298[local_1bc];
          local_a0 = local_298[local_1c0];
          local_168 = (local_208 - local_200) + 1;
          local_170 = (local_218 - local_210) + 1;
          local_178 = (local_228 - local_220) + 1;
          local_160 = (local_238 - local_230) + 1;
          local_180 = (local_248 - local_240) + 1;
          local_188 = (local_258 - local_250) + 1;
        }
        if (local_160 != local_188) {
          local_1c4 = local_1c4 + -1;
          local_1c8 = local_1c8 + -1;
          local_220 = *(long *)((long)in_stack_00000020 + (long)local_1c4 * 8);
          local_228 = *(long *)((long)in_stack_00000028 + (long)local_1c4 * 8);
          local_230 = *(long *)((long)in_stack_00000020 + (long)local_1c8 * 8);
          local_238 = *(long *)((long)in_stack_00000028 + (long)local_1c8 * 8);
          local_a8 = local_2d8[local_1c4];
          local_b0 = local_2d8[local_1c8];
          local_168 = (local_208 - local_200) + 1;
          local_170 = (local_218 - local_210) + 1;
          local_178 = (local_228 - local_220) + 1;
          local_160 = (local_238 - local_230) + 1;
          local_180 = (local_248 - local_240) + 1;
          local_188 = (local_258 - local_250) + 1;
        }
      }
    }
    else {
      local_1bc = local_1bc + -1;
      local_1c0 = local_1c0 + -1;
      local_200 = *(long *)((long)local_60 + (long)local_1bc * 8);
      local_208 = *(long *)((long)in_stack_00000008 + (long)local_1bc * 8);
      local_210 = *(long *)((long)local_60 + (long)local_1c0 * 8);
      local_218 = *(long *)((long)in_stack_00000008 + (long)local_1c0 * 8);
      local_98 = local_298[local_1bc];
      local_a0 = local_298[local_1c0];
      local_168 = (local_208 - local_200) + 1;
      local_170 = (local_218 - local_210) + 1;
      local_178 = (local_228 - local_220) + 1;
      local_160 = (local_238 - local_230) + 1;
      local_180 = (local_248 - local_240) + 1;
      local_188 = (local_258 - local_250) + 1;
    }
  }
  if ((local_248 - local_240) + 1 != local_168) {
    pnga_error(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
  }
  if ((local_258 - local_250) + 1 != local_160) {
    pnga_error(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
  }
  if ((local_228 - local_220) + 1 != local_170) {
    pnga_error(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
  }
  local_398 = ((double)local_170 * (double)(local_168 * local_160)) / (double)(local_3a0 * local_d0)
  ;
  dVar9 = pow(local_398,0.3333333333333333);
  local_3a8 = (long)dVar9;
  if (local_3a8 < 0x20) {
    local_3a8 = 0x20;
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = ga_types[local_80 + -1000].size;
  lVar8 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x10)) / auVar1,0);
  local_1f0 = 0x100;
  local_1f8 = 0x100;
  local_1e8 = 0x100;
  if (0x100 < local_3a8) {
    IVar4 = pnga_memory_avail_type((Integer)alpha_00);
    pnga_type_f2c(0x3f2);
    pnga_gop((Integer)dims,lo,(Integer)hi,(char *)ilo_00);
    if ((IVar4 < 0x40) && (IVar7 = pnga_nodeid(), IVar7 == 0)) {
      pnga_error(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
    }
    lVar3 = local_3a8;
    dVar9 = sqrt((double)(((long)((double)IVar4 * 0.9) + -4) / 3));
    if ((long)dVar9 < lVar3) {
      dVar9 = sqrt((double)(((long)((double)IVar4 * 0.9) + -4) / 3));
      local_430 = (long)dVar9;
    }
    else {
      local_430 = local_3a8;
    }
    local_3a8 = local_430;
    if (local_430 < local_168) {
      local_438 = local_430;
    }
    else {
      local_438 = local_168;
    }
    local_1e8 = local_438;
    local_1f8 = local_430;
    if (local_160 <= local_430) {
      local_1f8 = local_160;
    }
    local_1f0 = local_430;
    if (local_170 <= local_430) {
      local_1f0 = local_170;
    }
  }
  local_68 = (long *)pnga_malloc((Integer)hi,(int)((ulong)ilo_00 >> 0x20),(char *)ld);
  local_70 = local_68 + ((local_1e8 * local_1f0) / lVar8) * 2 + 2;
  local_78 = local_70 + ((local_1f0 * local_1f8) / lVar8) * 2 + 2;
  if (local_80 == 0x3ef) {
    if (((*local_50 == 0.0) && (!NAN(*local_50))) && ((local_50[1] == 0.0 && (!NAN(local_50[1])))))
    {
      local_1d4 = 0;
    }
  }
  else if (local_80 == 0x3ee) {
    if ((((*(float *)local_50 == 0.0) && (!NAN(*(float *)local_50))) &&
        (*(float *)((long)local_50 + 4) == 0.0)) && (!NAN(*(float *)((long)local_50 + 4)))) {
      local_1d4 = 0;
    }
  }
  else if (local_80 == 0x3ec) {
    if ((*local_50 == 0.0) && (!NAN(*local_50))) {
      local_1d4 = 0;
    }
  }
  else if ((*(float *)local_50 == 0.0) && (!NAN(*(float *)local_50))) {
    local_1d4 = 0;
  }
  if (local_1d4 == 0) {
    pnga_fill_patch(unaff_R13,unaff_R12,unaff_RBX,in_RDI);
  }
  else {
    pnga_scale_patch(unaff_R13,unaff_R12,unaff_RBX,in_RDI);
  }
  for (local_130 = 0; local_130 < local_160; local_130 = local_1f8 + local_130) {
    local_138 = local_160;
    if (local_130 + local_1f8 + -1 < local_160 + -1) {
      local_138 = local_130 + local_1f8;
    }
    local_138 = local_138 + -1;
    local_140 = (local_138 - local_130) + 1;
    for (local_148 = 0; local_148 < local_170; local_148 = local_1f0 + local_148) {
      local_150 = local_170;
      if (local_148 + local_1f0 + -1 < local_170 + -1) {
        local_150 = local_148 + local_1f0;
      }
      local_150 = local_150 + -1;
      local_158 = (local_150 - local_148) + 1;
      local_390 = 1;
      for (local_118 = 0; local_118 < local_168; local_118 = local_1e8 + local_118) {
        if (local_f0 % local_d0 == local_e0) {
          local_120 = local_168;
          if (local_118 + local_1e8 + -1 < local_168 + -1) {
            local_120 = local_118 + local_1e8;
          }
          local_120 = local_120 + -1;
          local_1a0 = (local_120 - local_118) + 1;
          if (local_80 == 0x3eb) {
            for (local_e8 = 0; local_e8 < local_1a0 * local_140; local_e8 = local_e8 + 1) {
              *(undefined4 *)((long)local_78 + local_e8 * 4) = 0;
            }
          }
          else if (local_80 == 0x3ec) {
            for (local_e8 = 0; local_e8 < local_1a0 * local_140; local_e8 = local_e8 + 1) {
              local_78[local_e8] = 0;
            }
          }
          else if (local_80 == 0x3ee) {
            for (local_e8 = 0; local_e8 < local_1a0 * local_140; local_e8 = local_e8 + 1) {
              *(undefined4 *)(local_78 + local_e8) = 0;
              *(undefined4 *)((long)local_78 + local_e8 * 8 + 4) = 0;
            }
          }
          else {
            for (local_e8 = 0; local_e8 < local_1a0 * local_140; local_e8 = local_e8 + 1) {
              local_78[local_e8 * 2] = 0;
              local_78[local_e8 * 2 + 1] = 0;
            }
          }
          if ((*in_RDI == 'n') || (*in_RDI == 'N')) {
            local_f8 = local_200 + local_118;
            local_100 = local_200 + local_120;
            local_108 = local_210 + local_148;
            local_110 = local_210 + local_150;
            local_190 = local_1a0;
          }
          else {
            local_190 = local_158;
            local_f8 = local_210 + local_148;
            local_100 = local_210 + local_150;
            local_108 = local_200 + local_118;
            local_110 = local_200 + local_120;
          }
          local_128 = local_1a0;
          memcpy(local_360,local_60,local_1a8 << 3);
          memcpy(local_368,in_stack_00000008,local_1a8 << 3);
          for (local_3fc = 0; (long)local_3fc < local_1a8 + -1; local_3fc = local_3fc + 1) {
            local_358[local_3fc] = 1;
          }
          local_360[local_1bc] = local_f8;
          local_368[local_1bc] = local_100;
          local_360[local_1c0] = local_108;
          local_368[local_1c0] = local_110;
          local_358[local_1bc] = (local_100 - local_f8) + 1;
          local_358[local_1c0] = (local_110 - local_108) + 1;
          pnga_get(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,
                   in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0);
          if (local_390 != 0) {
            if ((*local_40 == 'n') || (*local_40 == 'N')) {
              local_198 = local_158;
              local_f8 = local_220 + local_148;
              local_100 = local_220 + local_150;
              local_108 = local_230 + local_130;
              local_110 = local_230 + local_138;
            }
            else {
              local_198 = local_140;
              local_f8 = local_230 + local_130;
              local_100 = local_230 + local_138;
              local_108 = local_220 + local_148;
              local_110 = local_220 + local_150;
            }
            memcpy(local_360,in_stack_00000020,local_1b0 << 3);
            memcpy(local_368,in_stack_00000028,local_1b0 << 3);
            for (local_400 = 0; (long)local_400 < local_1b0 + -1; local_400 = local_400 + 1) {
              local_358[local_400] = 1;
            }
            local_360[local_1c4] = local_f8;
            local_368[local_1c4] = local_100;
            local_360[local_1c8] = local_108;
            local_368[local_1c8] = local_110;
            local_358[local_1c4] = (local_100 - local_f8) + 1;
            local_358[local_1c8] = (local_110 - local_108) + 1;
            pnga_get(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,
                     in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0);
            local_390 = 0;
          }
          local_3b8 = local_128;
          local_3c0 = local_140;
          local_3c8 = local_158;
          local_3d0 = local_190;
          local_3d8 = local_198;
          switch(local_80) {
          case 0x3eb:
            ld = &local_3d0;
            hi = &local_3d8;
            lo = (Integer *)&local_380;
            alpha_00 = local_68;
            ilo_00 = local_70;
            dims = local_78;
            gal_sgemm_(in_RDI,local_40,&local_3b8,&local_3c0,&local_3c8,local_48);
            break;
          case 0x3ec:
            ld = &local_3d0;
            hi = &local_3d8;
            lo = local_378;
            alpha_00 = local_68;
            ilo_00 = local_70;
            dims = local_78;
            gal_dgemm_(in_RDI,local_40,&local_3b8,&local_3c0,&local_3c8,local_48);
            break;
          default:
            pnga_error(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
            break;
          case 0x3ee:
            ld = &local_3d0;
            hi = &local_3d8;
            lo = (Integer *)&local_380;
            alpha_00 = local_68;
            ilo_00 = local_70;
            dims = local_78;
            gal_cgemm_(in_RDI,local_40,&local_3b8,&local_3c0,&local_3c8,local_48);
            break;
          case 0x3ef:
            ld = &local_3d0;
            hi = &local_3d8;
            lo = local_378;
            alpha_00 = local_68;
            ilo_00 = local_70;
            dims = local_78;
            gal_zgemm_(in_RDI,local_40,&local_3b8,&local_3c0,&local_3c8,local_48);
          }
          local_f8 = local_240 + local_118;
          local_100 = local_240 + local_120;
          local_108 = local_250 + local_130;
          local_110 = local_250 + local_138;
          memcpy(local_360,in_stack_00000040,local_1b8 << 3);
          memcpy(local_368,in_stack_00000048,local_1b8 << 3);
          for (local_404 = 0; (long)local_404 < local_1b8 + -1; local_404 = local_404 + 1) {
            local_358[local_404] = 1;
          }
          local_360[local_1cc] = local_f8;
          local_368[local_1cc] = local_100;
          local_360[local_1d0] = local_108;
          local_368[local_1d0] = local_110;
          local_358[local_1cc] = (local_100 - local_f8) + 1;
          local_358[local_1d0] = (local_110 - local_108) + 1;
          if ((local_80 == 0x3eb) || (local_80 == 0x3ee)) {
            pnga_acc((Integer)dims,lo,hi,ilo_00,ld,alpha_00);
          }
          else {
            pnga_acc((Integer)dims,lo,hi,ilo_00,ld,alpha_00);
          }
        }
        local_f0 = local_f0 + 1;
      }
    }
  }
  pnga_free((void *)0x17533b);
  if (local_3b0 != 0) {
    pnga_sync();
  }
  return;
}

Assistant:

void gai_matmul_patch(char *transa, char *transb, void *alpha, void *beta, 
    Integer g_a, Integer alo[], Integer ahi[], int avec_pos,
    Integer g_b, Integer blo[], Integer bhi[], int bvec_pos,
    Integer g_c, Integer clo[], Integer chi[])
{
#ifdef STATBUF
   DoubleComplex a[ICHUNK*KCHUNK], b[KCHUNK*JCHUNK], c[ICHUNK*JCHUNK];
#else
   DoubleComplex *a, *b, *c;
#endif
Integer atype, btype, ctype, adim1, adim2, bdim1, bdim2, cdim1, cdim2;
Integer me= pnga_nodeid(), nproc, inode, iproc;
Integer i, ijk = 0, i0, i1, j0, j1;
Integer ilo, ihi, idim, jlo, jhi, jdim, klo, khi, kdim;
Integer n, m, k, k2, cm, cn, adim, bdim, cdim, arank, brank, crank;
int aipos, ajpos, bipos, bjpos,cipos, cjpos, need_scaling=1;
int avpos, bvpos, cvpos;
Integer Ichunk, Kchunk, Jchunk;
Integer ailo, aihi, ajlo, ajhi;    /* 2d plane of g_a */
Integer bilo, bihi, bjlo, bjhi;    /* 2d plane of g_b */
Integer cilo, cihi, cjlo, cjhi;    /* 2d plane of g_c */
Integer adims[GA_MAX_DIM],bdims[GA_MAX_DIM],cdims[GA_MAX_DIM],tmpld[GA_MAX_DIM];
Integer *tmplo = adims, *tmphi =bdims; 
DoubleComplex ONE;
SingleComplex ONE_CF;
Integer ZERO_I = 0;
Integer get_new_B;
DoublePrecision chunk_cube;
Integer min_tasks = 10, max_chunk;
int local_sync_begin,local_sync_end;
BlasInt idim_t, jdim_t, kdim_t, adim_t, bdim_t, cdim_t;

   ONE.real =1.; ONE.imag =0.;
   ONE_CF.real =1.; ONE_CF.imag =0.;
   
   local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
   _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
   if(local_sync_begin)pnga_sync();

   if (pnga_total_blocks(g_a) > 0 || pnga_total_blocks(g_b) > 0 ||
       pnga_total_blocks(g_c) > 0) {
     pnga_matmul_basic(transa, transb, alpha, beta, g_a, alo, ahi,
         g_b, blo, bhi, g_c, clo, chi);
     return;
   }

   /* Check to make sure all global arrays are of the same type */
   if (!(pnga_is_mirrored(g_a) == pnga_is_mirrored(g_b) &&
        pnga_is_mirrored(g_a) == pnga_is_mirrored(g_c))) {
     pnga_error("Processors do not match for all arrays",pnga_nnodes());
   }
   if (pnga_is_mirrored(g_a)) {
     inode = pnga_cluster_nodeid();
     nproc = pnga_cluster_nprocs(inode);
     iproc = me - pnga_cluster_procid(inode, ZERO_I);
   } else {
     nproc = pnga_nnodes();
     iproc = me;
   }

   pnga_inquire(g_a, &atype, &arank, adims);
   pnga_inquire(g_b, &btype, &brank, bdims);
   pnga_inquire(g_c, &ctype, &crank, cdims);

   if(arank<2)  pnga_error("rank of A must be at least 2",arank);
   if(brank<2)  pnga_error("rank of B must be at least 2",brank);
   if(crank<2)  pnga_error("rank of C must be at least 2",crank);

   if(atype != btype || atype != ctype ) pnga_error(" types mismatch ", 0L);
   if(atype != C_DCPL && atype != C_DBL && atype != C_FLOAT && atype != C_SCPL)
     pnga_error(" type error",atype);
   
   gai_setup_2d_patch(arank, transa, adims, alo, ahi, &ailo, &aihi,
                      &ajlo, &ajhi, &adim1, &adim2, &aipos, &ajpos, &avpos, avec_pos);
   gai_setup_2d_patch(brank, transb, bdims, blo, bhi, &bilo, &bihi,
                      &bjlo, &bjhi, &bdim1, &bdim2, &bipos, &bjpos, &bvpos, bvec_pos);
   gai_setup_2d_patch(crank, NULL, cdims, clo, chi, &cilo, &cihi,
                      &cjlo, &cjhi, &cdim1, &cdim2, &cipos, &cjpos, &cvpos, -1);


   /* check if patch indices and dims match */
   if (*transa == 'n' || *transa == 'N'){
      if (ailo <= 0 || aihi > adim1 || ajlo <= 0 || ajhi > adim2)
         pnga_error("  g_a indices out of range ", g_a);
   }else
      if (ailo <= 0 || aihi > adim2 || ajlo <= 0 || ajhi > adim1)
         pnga_error("  g_a indices out of range ", g_a);

   if (*transb == 'n' || *transb == 'N'){
      if (bilo <= 0 || bihi > bdim1 || bjlo <= 0 || bjhi > bdim2)
          pnga_error("  g_b indices out of range ", g_b);
   }else
      if (bilo <= 0 || bihi > bdim2 || bjlo <= 0 || bjhi > bdim1)
          pnga_error("  g_b indices out of range ", g_b);


   if (cilo <= 0 || cihi > cdim1 || cjlo <= 0 || cjhi > cdim2)
       pnga_error("  g_c indices out of range ", g_c);

   /* verify if patch dimensions are consistent */
#define RESET() do {   \
   m = aihi - ailo +1; \
   k = ajhi - ajlo +1; \
   k2= bihi - bilo +1; \
   n = bjhi - bjlo +1; \
   cm= cihi - cilo +1; \
   cn= cjhi - cjlo +1; \
} while (0)
   RESET();
#define SHIFT(L,INC) do {      \
   L##ipos+=INC;               \
   L##jpos+=INC;               \
   L##ilo = L##lo[L##ipos];    \
   L##ihi = L##hi[L##ipos];    \
   L##jlo = L##lo[L##jpos];    \
   L##jhi = L##hi[L##jpos];    \
   L##dim1 = L##dims[L##ipos]; \
   L##dim2 = L##dims[L##jpos]; \
   RESET();                    \
} while (0)
   /* gai_setup_2d_patch may produce ambiguous vectors */
   if (!(m==cm && k==k2 && n==cn)) {
       /* patches don't agree */
       if (avpos>=0 && bvpos<0 && cvpos<0) {
           /* only A is an ambiguous vector */
           SHIFT(a,-1);
       }
       else if (avpos<0 && bvpos>=0 && cvpos<0) {
           /* only B is an ambiguous vector */
           SHIFT(b,-1);
       }
       else if (avpos<0 && bvpos<0 && cvpos>=0) {
           /* only C is an ambiguous vector */
           SHIFT(c,-1);
       }
       else if (avpos>=0 && bvpos>=0 && cvpos<0) {
           /* A and B are ambiguous vectors */
           if (m != cm) {
               SHIFT(a,-1);
           }
           if (n != cn) {
               SHIFT(b,-1);
           }
       }
       else if (avpos>=0 && bvpos<0 && cvpos>=0) {
           /* A and C are ambiguous vectors */
           if (k != k2) {
               SHIFT(a,-1);
           }
           if (n != cn) {
               SHIFT(c,-1);
           }
       }
       else if (avpos<0 && bvpos>=0 && cvpos>=0) {
           /* B and C are ambiguous vectors */
           if (k != k2) {
               SHIFT(b,-1);
           }
           if (m != cm) {
               SHIFT(c,-1);
           }
       }
       else if (avpos>=0 && bvpos>=0 && cvpos>=0) {
           /* A and B and C are ambiguous vectors */
           pnga_error("a and b and c ambiguous", 1);
       }
   }
   if( (cihi - cilo +1) != m) pnga_error(" a & c dims error",m);
   if( (cjhi - cjlo +1) != n) pnga_error(" b & c dims error",n);
   if( (bihi - bilo +1) != k) pnga_error(" a & b dims error",k);
   
   chunk_cube = (k*(double)(m*n)) / (min_tasks * nproc);
   max_chunk = (Integer)pow(chunk_cube, (DoublePrecision)(1.0/3.0) );
   if (max_chunk < 32) max_chunk = 32;
   
#ifdef STATBUF
   if(atype ==  C_DBL || atype == C_FLOAT){
      Ichunk=D_CHUNK, Kchunk=D_CHUNK, Jchunk=D_CHUNK;
   }else{
      Ichunk=ICHUNK; Kchunk=KCHUNK; Jchunk=JCHUNK;
   }
#else
   {
     Integer elems, factor = sizeof(DoubleComplex)/GAsizeofM(atype);
     Ichunk = Jchunk = Kchunk = CHUNK_SIZE;
     
     if ( max_chunk > Ichunk) {       
       /*if memory if very limited, performance degrades for large matrices
	 as chunk size is very small, which leads to communication overhead)*/
       Integer avail = pnga_memory_avail_type(atype);
       pnga_gop(pnga_type_f2c(MT_F_INT), &avail, (Integer)1, "min");
       if(avail<MINMEM && pnga_nodeid()==0) pnga_error("Not enough memory",avail);
       elems = (Integer)(avail*0.9);/* Donot use every last drop */
       
       max_chunk=GA_MIN(max_chunk, (Integer)(sqrt( (double)((elems-EXTRA)/3))));
       Ichunk = GA_MIN(m,max_chunk);
       Jchunk = GA_MIN(n,max_chunk);
       Kchunk = GA_MIN(k,max_chunk);
     }
     else /* "EXTRA" elems for safety - just in case */
       elems = 3*Ichunk*Jchunk + EXTRA*factor;

     a = (DoubleComplex*) pnga_malloc(elems, atype, "GA mulmat bufs");     
     b = a + (Ichunk*Kchunk)/factor + 1; 
     c = b + (Kchunk*Jchunk)/factor + 1;
   }
#endif

   if(atype==C_DCPL){if((((DoubleComplex*)beta)->real == 0) &&
	       (((DoubleComplex*)beta)->imag ==0)) need_scaling =0;} 
   else if(atype==C_SCPL){if((((SingleComplex*)beta)->real == 0) &&
	       (((SingleComplex*)beta)->imag ==0)) need_scaling =0;} 
   else if(atype==C_DBL){if(*(DoublePrecision *)beta == 0)need_scaling =0;}
   else if( *(float*)beta ==0) need_scaling =0;

   if(need_scaling) pnga_scale_patch(g_c, clo, chi, beta);
   else      pnga_fill_patch(g_c, clo, chi, beta);
  
   for(jlo = 0; jlo < n; jlo += Jchunk){ /* loop through columns of g_c patch */
       jhi = GA_MIN(n-1, jlo+Jchunk-1);
       jdim= jhi - jlo +1;
       
       for(klo = 0; klo < k; klo += Kchunk){    /* loop cols of g_a patch */
	 khi = GA_MIN(k-1, klo+Kchunk-1);        /* loop rows of g_b patch */
	 kdim= khi - klo +1;               

	 get_new_B = TRUE;
	 
	 for(ilo = 0; ilo < m; ilo += Ichunk){ /*loop through rows of g_c patch */
	   
	   if(ijk%nproc == iproc){
	     ihi = GA_MIN(m-1, ilo+Ichunk-1);
	     idim= cdim = ihi - ilo +1;
	     
	     if(atype == C_FLOAT) 
	       for (i = 0; i < idim*jdim; i++) *(((float*)c)+i)=0;
	     else if(atype ==  C_DBL)
	       for (i = 0; i < idim*jdim; i++) *(((double*)c)+i)=0;
	     else if(atype == C_SCPL)
	       for (i = 0; i < idim*jdim; i++){
                 ((SingleComplex*)c)[i].real=0;
                 ((SingleComplex*)c)[i].imag=0;
               }
             else
	       for (i = 0; i < idim*jdim; i++){ c[i].real=0;c[i].imag=0;}
	     
	     if (*transa == 'n' || *transa == 'N'){ 
	       adim = idim;
	       i0= ailo+ilo; i1= ailo+ihi;   
	       j0= ajlo+klo; j1= ajlo+khi;
	     }else{
	       adim = kdim;
	       i0= ajlo+klo; i1= ajlo+khi;   
	       j0= ailo+ilo; j1= ailo+ihi;
	     }

	     /* ga_get_(g_a, &i0, &i1, &j0, &j1, a, &adim); */
	     memcpy(tmplo,alo,arank*sizeof(Integer));
	     memcpy(tmphi,ahi,arank*sizeof(Integer));
	     SETINT(tmpld,1,arank-1);
	     tmplo[aipos]=i0; tmphi[aipos]=i1;
	     tmplo[ajpos]=j0; tmphi[ajpos]=j1;
	     tmpld[aipos]=i1-i0+1;
	     tmpld[ajpos]=j1-j0+1;
	     pnga_get(g_a,tmplo,tmphi,a,tmpld);
	     
	     if(get_new_B) {
	       if (*transb == 'n' || *transb == 'N'){ 
		 bdim = kdim;
		 i0= bilo+klo; i1= bilo+khi;   
		 j0= bjlo+jlo; j1= bjlo+jhi;
	       }else{
		 bdim = jdim;
		 i0= bjlo+jlo; i1= bjlo+jhi;   
		 j0= bilo+klo; j1= bilo+khi;
	       }
	       /* ga_get_(g_b, &i0, &i1, &j0, &j1, b, &bdim); */
	       memcpy(tmplo,blo,brank*sizeof(Integer));
	       memcpy(tmphi,bhi,brank*sizeof(Integer));
	       SETINT(tmpld,1,brank-1);
	       tmplo[bipos]=i0; tmphi[bipos]=i1;
	       tmplo[bjpos]=j0; tmphi[bjpos]=j1;
	       tmpld[bipos]=i1-i0+1;
	       tmpld[bjpos]=j1-j0+1;
	       pnga_get(g_b,tmplo,tmphi,b,tmpld);
	       get_new_B = FALSE;
	     }

	     idim_t=idim; jdim_t=jdim; kdim_t=kdim;
	     adim_t=adim; bdim_t=bdim; cdim_t=cdim;

		  switch(atype) {
		  case C_FLOAT:
		    BLAS_SGEMM(transa, transb, &idim_t, &jdim_t, &kdim_t,
			   (Real *)alpha, (Real *)a, &adim_t,
               (Real *)b, &bdim_t, (Real *)&ONE_CF,
               (Real *)c, &cdim_t);
		    break;
		  case C_DBL:
		    BLAS_DGEMM(transa, transb, &idim_t, &jdim_t, &kdim_t,
			   (DoublePrecision *)alpha, (DoublePrecision *)a, &adim_t,
               (DoublePrecision *)b, &bdim_t, (DoublePrecision *)&ONE,
               (DoublePrecision *)c, &cdim_t);
		    break;
		  case C_DCPL:
		    BLAS_ZGEMM(transa, transb, &idim_t, &jdim_t, &kdim_t,
			   (DoubleComplex *)alpha, (DoubleComplex *)a, &adim_t,
               (DoubleComplex *)b, &bdim_t, (DoubleComplex *)&ONE,
               (DoubleComplex *)c, &cdim_t);
		    break;
		  case C_SCPL:
		    BLAS_CGEMM(transa, transb, &idim_t, &jdim_t, &kdim_t,
			   (SingleComplex *)alpha, (SingleComplex *)a, &adim_t,
               (SingleComplex *)b, &bdim_t, (SingleComplex *)&ONE_CF,
               (SingleComplex *)c, &cdim_t);
		    break;
		  default:
		    pnga_error("ga_matmul_patch: wrong data type", atype);
		  }

                  i0= cilo+ilo; i1= cilo+ihi;   j0= cjlo+jlo; j1= cjlo+jhi;
                  /* ga_acc_(g_c, &i0, &i1, &j0, &j1, (DoublePrecision*)c, 
                                            &cdim, (DoublePrecision*)&ONE); */
		  memcpy(tmplo,clo,crank*sizeof(Integer));
		  memcpy(tmphi,chi,crank*sizeof(Integer));
		  SETINT(tmpld,1,crank-1);
		  tmplo[cipos]=i0; tmphi[cipos]=i1;
		  tmplo[cjpos]=j0; tmphi[cjpos]=j1;
		  tmpld[cipos]=i1-i0+1;
		  tmpld[cjpos]=j1-j0+1;
		  if(atype == C_FLOAT || atype == C_SCPL) 
		    pnga_acc(g_c,tmplo,tmphi,(float *)c,tmpld, &ONE_CF);
		  else
		    pnga_acc(g_c,tmplo,tmphi,c,tmpld,(DoublePrecision*)&ONE);
               }
	   ++ijk;
	 }
       }
   }

#ifndef STATBUF
   pnga_free(a);
#endif
   
   if(local_sync_end)pnga_sync(); 
}